

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O0

int OpenOutputFile(char *output_path,FILE **f,int force)

{
  int __fd;
  FILE *pFVar1;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  uint uVar5;
  int fd;
  int force_local;
  FILE **f_local;
  char *output_path_local;
  
  *f = (FILE *)0x0;
  if (output_path == (char *)0x0) {
    pFVar1 = fdopen(1,"wb");
    *f = (FILE *)pFVar1;
    output_path_local._4_4_ = 1;
  }
  else {
    uVar5 = 0x80;
    if (force != 0) {
      uVar5 = 0;
    }
    __fd = open(output_path,uVar5 | 0x241,0x180);
    pFVar1 = _stderr;
    if (__fd < 0) {
      pcVar2 = PrintablePath(output_path);
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(pFVar1,"failed to open output file [%s]: %s\n",pcVar2,pcVar4);
      output_path_local._4_4_ = 0;
    }
    else {
      pFVar1 = fdopen(__fd,"wb");
      *f = (FILE *)pFVar1;
      pFVar1 = _stderr;
      if (*f == (FILE *)0x0) {
        pcVar2 = PrintablePath(output_path);
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(pFVar1,"failed to open output file [%s]: %s\n",pcVar2,pcVar4);
        output_path_local._4_4_ = 0;
      }
      else {
        output_path_local._4_4_ = 1;
      }
    }
  }
  return output_path_local._4_4_;
}

Assistant:

static BROTLI_BOOL OpenOutputFile(const char* output_path, FILE** f,
                                  BROTLI_BOOL force) {
  int fd;
  *f = NULL;
  if (!output_path) {
    *f = fdopen(MAKE_BINARY(STDOUT_FILENO), "wb");
    return BROTLI_TRUE;
  }
  fd = open(output_path, O_CREAT | (force ? 0 : O_EXCL) | O_WRONLY | O_TRUNC,
            S_IRUSR | S_IWUSR);
  if (fd < 0) {
    fprintf(stderr, "failed to open output file [%s]: %s\n",
            PrintablePath(output_path), strerror(errno));
    return BROTLI_FALSE;
  }
  *f = fdopen(fd, "wb");
  if (!*f) {
    fprintf(stderr, "failed to open output file [%s]: %s\n",
            PrintablePath(output_path), strerror(errno));
    return BROTLI_FALSE;
  }
  return BROTLI_TRUE;
}